

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void R_DeinitTranslationTables(void)

{
  uint uVar1;
  FRemapTablePtr *pFVar2;
  FRemapTable *pFVar3;
  uint local_10;
  int local_c;
  uint j;
  int i;
  
  for (local_c = 0; local_c < 0xb; local_c = local_c + 1) {
    local_10 = 0;
    while( true ) {
      uVar1 = TArray<FRemapTablePtr,_FRemapTable_*>::Size
                        (&translationtables[local_c].super_TArray<FRemapTablePtr,_FRemapTable_*>);
      if (uVar1 <= local_10) break;
      pFVar2 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                         (&translationtables[local_c].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                          (ulong)local_10);
      pFVar3 = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar2);
      if (pFVar3 != (FRemapTable *)0x0) {
        pFVar2 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[local_c].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                            (ulong)local_10);
        pFVar3 = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar2);
        if (pFVar3 != (FRemapTable *)0x0) {
          FRemapTable::~FRemapTable(pFVar3);
          operator_delete(pFVar3,0x20);
        }
        pFVar2 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                           (&translationtables[local_c].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                            (ulong)local_10);
        FRemapTablePtr::operator=(pFVar2,(FRemapTable *)0x0);
      }
      local_10 = local_10 + 1;
    }
    TArray<FRemapTablePtr,_FRemapTable_*>::Clear
              (&translationtables[local_c].super_TArray<FRemapTablePtr,_FRemapTable_*>);
  }
  TArray<PalEntry,_PalEntry>::Clear(&BloodTranslationColors);
  return;
}

Assistant:

void R_DeinitTranslationTables()
{
	for (int i = 0; i < NUM_TRANSLATION_TABLES; ++i)
	{
		for (unsigned int j = 0; j < translationtables[i].Size(); ++j)
		{
			if (translationtables[i][j] != NULL)
			{
				delete translationtables[i][j];
				translationtables[i][j] = NULL;
			}
		}
		translationtables[i].Clear();
	}
	BloodTranslationColors.Clear();
}